

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_done(connectdata *conn,CURLcode status,_Bool premature)

{
  SessionHandle *data_00;
  FormData **form_ptr;
  FormData *pFVar1;
  Curl_send_buffer *buff;
  HTTP *http;
  SessionHandle *data;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  form_ptr = (FormData **)(data_00->req).protop;
  conn->fread_func = (data_00->set).fread_func;
  conn->fread_in = (data_00->set).in;
  conn->seek_func = (data_00->set).seek_func;
  conn->seek_client = (data_00->set).seek_client;
  if (form_ptr == (FormData **)0x0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if (form_ptr[0x10] != (FormData *)0x0) {
      pFVar1 = form_ptr[0x10];
      (*Curl_cfree)(pFVar1->next);
      (*Curl_cfree)(pFVar1);
      form_ptr[0x10] = (FormData *)0x0;
    }
    if ((data_00->set).httpreq == HTTPREQ_POST_FORM) {
      (data_00->req).bytecount = (long)&form_ptr[6]->next + (long)&form_ptr[5]->next;
      Curl_formclean(form_ptr);
      if (form_ptr[9] != (FormData *)0x0) {
        fclose((FILE *)form_ptr[9]);
        form_ptr[9] = (FormData *)0x0;
      }
    }
    else if ((data_00->set).httpreq == HTTPREQ_PUT) {
      (data_00->req).bytecount = (long)&form_ptr[6]->next + (long)&form_ptr[5]->next;
    }
    conn_local._4_4_ = status;
    if (status == CURLE_OK) {
      if ((((premature) || (((conn->bits).retry & 1U) != 0)) ||
          (((data_00->set).connect_only & 1U) != 0)) ||
         (0 < (long)form_ptr[5] +
              ((data_00->req).headerbytecount - (data_00->req).deductheadercount))) {
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        Curl_failf(data_00,"Empty reply from server");
        conn_local._4_4_ = CURLE_GOT_NOTHING;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_done(struct connectdata *conn,
                        CURLcode status, bool premature)
{
  struct SessionHandle *data = conn->data;
  struct HTTP *http =data->req.protop;

  Curl_unencode_cleanup(conn);

#ifdef USE_SPNEGO
  if(data->state.proxyneg.state == GSS_AUTHSENT ||
      data->state.negotiate.state == GSS_AUTHSENT)
    Curl_cleanup_negotiate(data);
#endif

  /* set the proper values (possibly modified on POST) */
  conn->fread_func = data->set.fread_func; /* restore */
  conn->fread_in = data->set.in; /* restore */
  conn->seek_func = data->set.seek_func; /* restore */
  conn->seek_client = data->set.seek_client; /* restore */

  if(http == NULL)
    return CURLE_OK;

  if(http->send_buffer) {
    Curl_send_buffer *buff = http->send_buffer;

    free(buff->buffer);
    free(buff);
    http->send_buffer = NULL; /* clear the pointer */
  }

  if(HTTPREQ_POST_FORM == data->set.httpreq) {
    data->req.bytecount = http->readbytecount + http->writebytecount;

    Curl_formclean(&http->sendit); /* Now free that whole lot */
    if(http->form.fp) {
      /* a file being uploaded was left opened, close it! */
      fclose(http->form.fp);
      http->form.fp = NULL;
    }
  }
  else if(HTTPREQ_PUT == data->set.httpreq)
    data->req.bytecount = http->readbytecount + http->writebytecount;

  if(status != CURLE_OK)
    return (status);

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     ((http->readbytecount +
       data->req.headerbytecount -
       data->req.deductheadercount)) <= 0) {
    /* If this connection isn't simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this can't be right so we
       return an error here */
    failf(data, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}